

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UserManager.hpp
# Opt level: O1

bool __thiscall sjtu::UserManager::is_login(UserManager *this,string *username)

{
  BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_> *this_00;
  pointer pcVar1;
  int iVar2;
  undefined4 extraout_var;
  long lVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  pair<long,_bool> pVar7;
  long local_58;
  char local_50;
  long *local_48;
  long local_40;
  long local_38 [2];
  ulong local_28;
  
  this_00 = this->UserBpTree;
  pcVar1 = (username->_M_dataplus)._M_p;
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + username->_M_string_length);
  if (local_40 == 0) {
    local_28 = 0;
  }
  else {
    lVar4 = 0;
    lVar3 = 0;
    local_28 = 0;
    do {
      uVar5 = (ulong)((int)*(char *)((long)local_48 + lVar4) + 0x100);
      lVar3 = (long)(lVar3 * 0x239 + uVar5) % 0x3b800001;
      local_28 = (long)(local_28 * 0x301 + uVar5) % 0x3b9aca07;
      lVar4 = lVar4 + 1;
    } while (local_40 != lVar4);
    local_28 = lVar3 << 0x20 | local_28;
  }
  pVar7 = BplusTree<unsigned_long_long,_long,_100,_std::less<unsigned_long_long>_>::find
                    (this_00,&local_28);
  local_58 = pVar7.first;
  local_50 = pVar7.second;
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  if (local_50 == '\0') {
    bVar6 = false;
  }
  else {
    iVar2 = (*(this->UserFile->super_FileManager_Base<sjtu::userType>)._vptr_FileManager_Base[2])
                      (this->UserFile,&local_58);
    bVar6 = *(uint *)(CONCAT44(extraout_var,iVar2) + 0x6c) == this->online_flag;
  }
  return bVar6;
}

Assistant:

bool is_login(std::string username) {
            std::pair<locType, bool> tmp = UserBpTree->find(hasher(username));
            if (tmp.second == false) return false;
            else {
                userType *cur = UserFile->read(tmp.first);
                return cur->is_online == online_flag;
            }
        }